

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O1

void Res_SimPerformOne(Abc_Obj_t *pNode,Vec_Ptr_t *vSimInfo,int nSimWords)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  void **ppvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  
  uVar1 = *(uint *)&pNode->field_0x14;
  if ((uVar1 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                  ,0x178,"void Res_SimPerformOne(Abc_Obj_t *, Vec_Ptr_t *, int)");
  }
  iVar2 = pNode->Id;
  if ((-1 < (long)iVar2) && (iVar3 = vSimInfo->nSize, iVar2 < iVar3)) {
    piVar6 = (pNode->vFanins).pArray;
    iVar4 = *piVar6;
    if ((-1 < (long)iVar4) && (iVar4 < iVar3)) {
      iVar5 = piVar6[1];
      if ((-1 < (long)iVar5) && (iVar5 < iVar3)) {
        ppvVar7 = vSimInfo->pArray;
        pvVar8 = ppvVar7[iVar2];
        pvVar9 = ppvVar7[iVar4];
        pvVar10 = ppvVar7[iVar5];
        if ((uVar1 >> 0xb & 1) == 0 || (uVar1 >> 10 & 1) == 0) {
          if ((uVar1 >> 10 & 1) == 0 || (uVar1 >> 0xb & 1) != 0) {
            if (((byte)(uVar1 >> 0xb) & (uVar1 >> 10 & 1) == 0) == 0) {
              if (0 < nSimWords) {
                uVar11 = 0;
                do {
                  *(uint *)((long)pvVar8 + uVar11 * 4) =
                       *(uint *)((long)pvVar10 + uVar11 * 4) & *(uint *)((long)pvVar9 + uVar11 * 4);
                  uVar11 = uVar11 + 1;
                } while ((uint)nSimWords != uVar11);
              }
            }
            else if (0 < nSimWords) {
              uVar11 = 0;
              do {
                *(uint *)((long)pvVar8 + uVar11 * 4) =
                     ~*(uint *)((long)pvVar10 + uVar11 * 4) & *(uint *)((long)pvVar9 + uVar11 * 4);
                uVar11 = uVar11 + 1;
              } while ((uint)nSimWords != uVar11);
            }
          }
          else if (0 < nSimWords) {
            uVar11 = 0;
            do {
              *(uint *)((long)pvVar8 + uVar11 * 4) =
                   ~*(uint *)((long)pvVar9 + uVar11 * 4) & *(uint *)((long)pvVar10 + uVar11 * 4);
              uVar11 = uVar11 + 1;
            } while ((uint)nSimWords != uVar11);
          }
        }
        else if (0 < nSimWords) {
          uVar11 = 0;
          do {
            *(uint *)((long)pvVar8 + uVar11 * 4) =
                 ~(*(uint *)((long)pvVar10 + uVar11 * 4) | *(uint *)((long)pvVar9 + uVar11 * 4));
            uVar11 = uVar11 + 1;
          } while ((uint)nSimWords != uVar11);
        }
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Res_SimPerformOne( Abc_Obj_t * pNode, Vec_Ptr_t * vSimInfo, int nSimWords )
{
    unsigned * pInfo, * pInfo1, * pInfo2;
    int k, fComp1, fComp2;
    // simulate the internal nodes
    assert( Abc_ObjIsNode(pNode) );
    pInfo  = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
    pInfo1 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId0(pNode));
    pInfo2 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId1(pNode));
    fComp1 = Abc_ObjFaninC0(pNode);
    fComp2 = Abc_ObjFaninC1(pNode);
    if ( fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pInfo[k] = ~pInfo1[k] & ~pInfo2[k];
    else if ( fComp1 && !fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pInfo[k] = ~pInfo1[k] &  pInfo2[k];
    else if ( !fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pInfo[k] =  pInfo1[k] & ~pInfo2[k];
    else // if ( fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pInfo[k] =  pInfo1[k] &  pInfo2[k];
}